

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O3

void __thiscall
trimesh::merge_dag_t::get_contrib_cps
          (merge_dag_t *this,vector<int,_std::allocator<int>_> *l,eGDIR dir,int cp,int res)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Rb_tree_color _Var3;
  iterator __position;
  uint uVar4;
  _Base_ptr p_Var5;
  pointer pnVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  ulong uVar10;
  int g;
  node_t gnode;
  stack<int,_std::deque<int,_std::allocator<int>_>_> stk;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  uint local_d0;
  uint local_cc;
  undefined8 local_c8;
  int local_c0;
  _Deque_base<int,_std::allocator<int>_> local_b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  pnVar6 = (pointer)(this->m_cp_geom[dir].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + cp);
  while( true ) {
    uVar2 = pnVar6->base;
    local_cc = uVar2;
    if (get_node(int)::defnode == '\0') {
      get_contrib_cps();
    }
    uVar4 = local_cc;
    if ((int)uVar2 < 0) {
      pnVar6 = (pointer)&get_node(int)::defnode;
    }
    else {
      pnVar6 = (this->m_nodes).
               super__Vector_base<trimesh::merge_dag_t::node_t,_std::allocator<trimesh::merge_dag_t::node_t>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar2;
    }
    if (pnVar6->canc_no < res) break;
    uVar10 = (ulong)local_cc;
    if (get_node(int)::defnode == '\0') {
      get_contrib_cps();
    }
    pnVar6 = (pointer)&get_node(int)::defnode;
    if (-1 < (int)uVar4) {
      pnVar6 = (this->m_nodes).
               super__Vector_base<trimesh::merge_dag_t::node_t,_std::allocator<trimesh::merge_dag_t::node_t>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10;
    }
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_b8,0);
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_b8,(int *)&local_cc);
  }
  else {
    *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_cc;
    local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  do {
    if (((long)local_b8._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
        ((long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
        ((((ulong)((long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_b8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x80 == 0) {
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_b8);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      return;
    }
    if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
      local_d0 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
      operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first);
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
           local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
           (_Elt_pointer)((uint *)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80)
      ;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           (_Elt_pointer)((uint *)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f)
      ;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
           local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
    }
    else {
      local_d0 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
    }
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &p_Var1->_M_header;
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
    goto LAB_00159573;
    do {
      p_Var8 = p_Var9;
      p_Var7 = p_Var5;
      _Var3 = p_Var7[1]._M_color;
      p_Var9 = p_Var7;
      if ((int)_Var3 < (int)local_d0) {
        p_Var9 = p_Var8;
      }
      p_Var5 = (&p_Var7->_M_left)[(int)_Var3 < (int)local_d0];
    } while ((&p_Var7->_M_left)[(int)_Var3 < (int)local_d0] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 == p_Var1) goto LAB_00159573;
    if ((int)_Var3 < (int)local_d0) {
      p_Var7 = p_Var8;
    }
    if ((int)local_d0 < (int)p_Var7[1]._M_color) {
LAB_00159573:
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_d0);
      if ((int)local_d0 < 0) {
        local_c8 = CONCAT44(local_c8._4_4_,~local_d0);
        __position._M_current =
             (l->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (l->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (l,__position,(int *)&local_c8);
        }
        else {
          *__position._M_current = ~local_d0;
          (l->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      uVar2 = local_d0;
      if (get_node(int)::defnode == '\0') {
        get_contrib_cps();
      }
      if ((int)uVar2 < 0) {
        pnVar6 = (pointer)&get_node(int)::defnode;
      }
      else {
        pnVar6 = (this->m_nodes).
                 super__Vector_base<trimesh::merge_dag_t::node_t,_std::allocator<trimesh::merge_dag_t::node_t>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2;
      }
      local_c0 = pnVar6->canc_no;
      local_c8._0_4_ = pnVar6->base;
      local_c8._4_4_ = pnVar6->other;
      if ((undefined4)local_c8 != 0xffffffff) {
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)&local_b8,(int *)&local_c8);
        }
        else {
          *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (undefined4)local_c8;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)&local_b8,(int *)((long)&local_c8 + 4));
        }
        else {
          *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_c8._4_4_;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
    }
  } while( true );
}

Assistant:

void merge_dag_t::get_contrib_cps
(std::vector<int> &l, eGDIR dir,int cp,int res) const
{
  int g = m_cp_geom[dir][cp];

  while(get_node(g).canc_no >= res )
    g = get_node(g).base;

  std::set<int>    visited;

  std::stack<int> stk;

  stk.push(g);

  while(stk.size() != 0 )
  {
    int g = stk.top();
    stk.pop();

    if(visited.count(g) != 0 )
      continue;

    visited.insert(g);

    if( g < 0)
      l.push_back(-g-1);

    node_t gnode = get_node(g);

    if(gnode.base != -1)
    {
      stk.push(gnode.base);
      stk.push(gnode.other);
    }
  }
}